

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

Node * __thiscall
TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::NewKey
          (TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *this,FName *key)

{
  FName FVar1;
  undefined4 uVar2;
  Node *pNVar3;
  Node *pNVar4;
  uint uVar5;
  Node *pNVar6;
  Node *pNVar7;
  FName local_1c;
  
  uVar5 = this->Size - 1 & key->Index;
  pNVar4 = this->Nodes + uVar5;
  if (this->Nodes[uVar5].Next != (Node *)0x1) {
    pNVar3 = GetFreePos(this);
    if (pNVar3 == (Node *)0x0) {
      Rehash(this);
      local_1c = (FName)key->Index;
      pNVar4 = NewKey(this,&local_1c);
      return pNVar4;
    }
    pNVar7 = this->Nodes + (this->Size - 1 & (pNVar4->Pair).Key.Index);
    if (this->Nodes + (this->Size - 1 & (pNVar4->Pair).Key.Index) == pNVar4) {
      pNVar3->Next = pNVar4->Next;
      pNVar7 = pNVar3;
      goto LAB_003b3c2a;
    }
    do {
      pNVar6 = pNVar7;
      pNVar7 = pNVar6->Next;
    } while (pNVar7 != pNVar4);
    pNVar6->Next = pNVar3;
    (pNVar3->Pair).Value = (pNVar4->Pair).Value;
    FVar1.Index = (pNVar4->Pair).Key.Index;
    uVar2 = *(undefined4 *)&(pNVar4->Pair).field_0x4;
    pNVar3->Next = pNVar4->Next;
    (pNVar3->Pair).Key = (FName)FVar1.Index;
    *(undefined4 *)&(pNVar3->Pair).field_0x4 = uVar2;
  }
  pNVar3 = (Node *)0x0;
  pNVar7 = pNVar4;
LAB_003b3c2a:
  pNVar4->Next = pNVar3;
  this->NumUsed = this->NumUsed + 1;
  (pNVar7->Pair).Key.Index = key->Index;
  return pNVar7;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}